

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O2

void __thiscall
adios2::format::MallocV::MallocV
          (MallocV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize,
          size_t InitialBufferSize,double GrowthFactor)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)type);
  BufferV::BufferV(&this->super_BufferV,&local_50,AlwaysCopy,MemAlign,MemBlockSize);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_BufferV)._vptr_BufferV = (_func_int **)&PTR__MallocV_00821e08;
  this->m_InternalBlock = (char *)0x0;
  this->m_AllocatedSize = 0;
  this->m_InitialBufferSize = InitialBufferSize;
  this->m_GrowthFactor = GrowthFactor;
  return;
}

Assistant:

MallocV::MallocV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
                 const size_t MemBlockSize, size_t InitialBufferSize, double GrowthFactor)
: BufferV(type, AlwaysCopy, MemAlign, MemBlockSize), m_InitialBufferSize(InitialBufferSize),
  m_GrowthFactor(GrowthFactor)
{
}